

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

int Internal_FaceDegenerateAreaCheck(ON_MeshFace *f,int vertex_count,ON_3fPoint *fV,ON_3dPoint *dV)

{
  bool bVar1;
  ON_3dPoint *pOVar2;
  double dVar3;
  bool local_21b;
  bool local_21a;
  undefined1 local_218 [7];
  bool bRepaired;
  ON_3dVector local_200;
  ON_3dVector local_1e8;
  ON_3dVector local_1d0;
  ON_3dVector local_1b8;
  ON_3dVector local_1a0;
  ON_3dVector local_188;
  ON_3dVector local_170;
  ON_3dVector local_158;
  ON_3dVector local_140;
  ON_3dVector local_128;
  ON_3dVector local_110;
  ON_3dVector local_f8;
  ON_3dVector local_e0;
  ON_3dVector local_c8;
  undefined8 local_b0;
  double atol;
  double a [2];
  ON_3dPoint V [4];
  ON_3dPoint *dV_local;
  ON_3fPoint *fV_local;
  int vertex_count_local;
  ON_MeshFace *f_local;
  
  local_b0 = 0x38754484932d2e72;
  if (dV == (ON_3dPoint *)0x0) {
    ON_3dPoint::operator=((ON_3dPoint *)(a + 1),fV + f->vi[0]);
    ON_3dPoint::operator=((ON_3dPoint *)&V[0].z,fV + f->vi[1]);
    ON_3dPoint::operator=((ON_3dPoint *)&V[1].z,fV + f->vi[2]);
    ON_3dPoint::operator=((ON_3dPoint *)&V[2].z,fV + f->vi[3]);
  }
  else {
    pOVar2 = dV + f->vi[0];
    a[1] = pOVar2->x;
    V[0].x = pOVar2->y;
    V[0].y = pOVar2->z;
    pOVar2 = dV + f->vi[1];
    V[0].z = pOVar2->x;
    V[1].x = pOVar2->y;
    V[1].y = pOVar2->z;
    pOVar2 = dV + f->vi[2];
    V[1].z = pOVar2->x;
    V[2].x = pOVar2->y;
    V[2].y = pOVar2->z;
    pOVar2 = dV + f->vi[3];
    V[2].z = pOVar2->x;
    V[3].x = pOVar2->y;
    V[3].y = pOVar2->z;
  }
  bVar1 = ON_MeshFace::IsTriangle(f);
  if (bVar1) {
    ON_3dPoint::operator-(&local_e0,(ON_3dPoint *)&V[0].z,(ON_3dPoint *)(a + 1));
    ON_3dPoint::operator-(&local_f8,(ON_3dPoint *)&V[1].z,(ON_3dPoint *)(a + 1));
    ON_CrossProduct(&local_c8,&local_e0,&local_f8);
    dVar3 = ON_3dVector::Length(&local_c8);
    f_local._4_4_ = (uint)(1e-36 < dVar3);
  }
  else {
    atol = ON_3dPoint::DistanceTo((ON_3dPoint *)(a + 1),(ON_3dPoint *)&V[1].z);
    a[0] = ON_3dPoint::DistanceTo((ON_3dPoint *)&V[0].z,(ON_3dPoint *)&V[2].z);
    local_21a = 1e-36 < atol && 1e-36 < a[0];
    if (local_21a) {
      if (a[0] * 1e-08 < atol) {
        if (atol * 1e-08 < a[0]) {
          if (a[0] < atol) {
            if (atol <= a[0]) {
              return 0;
            }
            ON_3dPoint::operator-(&local_1b8,(ON_3dPoint *)&V[1].z,(ON_3dPoint *)&V[0].z);
            ON_3dPoint::operator-(&local_1d0,(ON_3dPoint *)&V[2].z,(ON_3dPoint *)&V[0].z);
            ON_CrossProduct(&local_1a0,&local_1b8,&local_1d0);
            atol = ON_3dVector::Length(&local_1a0);
            ON_3dPoint::operator-(&local_200,(ON_3dPoint *)&V[2].z,(ON_3dPoint *)&V[0].z);
            ON_3dPoint::operator-
                      ((ON_3dVector *)local_218,(ON_3dPoint *)(a + 1),(ON_3dPoint *)&V[0].z);
            ON_CrossProduct(&local_1e8,&local_200,(ON_3dVector *)local_218);
            a[0] = ON_3dVector::Length(&local_1e8);
            if (atol <= 1e-36) {
              if (1e-36 < a[0]) {
                f->vi[2] = -1;
              }
            }
            else {
              if (1e-36 < a[0]) {
                return 1;
              }
              f->vi[0] = -1;
            }
          }
          else {
            ON_3dPoint::operator-(&local_128,(ON_3dPoint *)&V[0].z,(ON_3dPoint *)(a + 1));
            ON_3dPoint::operator-(&local_140,(ON_3dPoint *)&V[1].z,(ON_3dPoint *)(a + 1));
            ON_CrossProduct(&local_110,&local_128,&local_140);
            atol = ON_3dVector::Length(&local_110);
            ON_3dPoint::operator-(&local_170,(ON_3dPoint *)&V[1].z,(ON_3dPoint *)(a + 1));
            ON_3dPoint::operator-(&local_188,(ON_3dPoint *)&V[2].z,(ON_3dPoint *)(a + 1));
            ON_CrossProduct(&local_158,&local_170,&local_188);
            a[0] = ON_3dVector::Length(&local_158);
            if (atol <= 1e-36) {
              if (1e-36 < a[0]) {
                f->vi[1] = -1;
              }
            }
            else {
              if (1e-36 < a[0]) {
                return 1;
              }
              f->vi[3] = -1;
            }
          }
          if (dV == (ON_3dPoint *)0x0) {
            local_21b = ON_MeshFace::Repair(f,vertex_count,fV);
          }
          else {
            local_21b = ON_MeshFace::Repair(f,vertex_count,dV);
          }
          f_local._4_4_ = 0;
          if (local_21b != false) {
            f_local._4_4_ = 2;
          }
        }
        else {
          f_local._4_4_ = 0;
        }
      }
      else {
        f_local._4_4_ = 0;
      }
    }
    else {
      f_local._4_4_ = 0;
    }
  }
  return f_local._4_4_;
}

Assistant:

static int Internal_FaceDegenerateAreaCheck(
  ON_MeshFace& f,
  int vertex_count,
  const ON_3fPoint* fV,
  const ON_3dPoint* dV
)
{
  // returns:
  // 0: f is degenerate
  // 1: f is not degenerate
  // 2: f was a degenerate quad and fixed to be a good triangle
  ON_3dPoint V[4];
  double a[2];
  const double atol = 1.0e-36; // a hair bigger than the smallest positive normalized float.
  if (nullptr != dV)
  {
    V[0] = dV[f.vi[0]];
    V[1] = dV[f.vi[1]];
    V[2] = dV[f.vi[2]];
    V[3] = dV[f.vi[3]];
  }
  else
  {
    V[0] = fV[f.vi[0]];
    V[1] = fV[f.vi[1]];
    V[2] = fV[f.vi[2]];
    V[3] = fV[f.vi[3]];
  }

  if (f.IsTriangle())
  {
    a[0] = ON_CrossProduct(V[1]-V[0],V[2]-V[0]).Length();
    return (a[0] > atol) ? 1 : 0;
  }
  
  a[0] = V[0].DistanceTo(V[2]);
  a[1] = V[1].DistanceTo(V[3]);

  // discard L shaped quads
  if (false == (a[0] > atol && a[1] > atol))
    return 0;

  if (a[0] <= a[1] * 1e-8)
    return 0; // quad is L shaped at floating point precision
  if (a[1] <= a[0] * 1e-8)
    return 0; // quad is L shaped at floating point precision

  if (a[0] <= a[1])
  {
    a[0] = ON_CrossProduct(V[1] - V[0], V[2] - V[0]).Length();
    a[1] = ON_CrossProduct(V[2] - V[0], V[3] - V[0]).Length();
    if (a[0] > atol)
    {
      if (a[1] > atol)
        return 1;
      f.vi[3] = -1;
    }
    else if (a[1] > atol)
      f.vi[1] = -1;
  }
  else if (a[1] < a[0] )
  {
    a[0] = ON_CrossProduct(V[2] - V[1], V[3] - V[1]).Length();
    a[1] = ON_CrossProduct(V[3] - V[1], V[0] - V[1]).Length();
    if (a[0] > atol)
    {
      if (a[1] > atol)
        return 1;
      f.vi[0] = -1;
    }
    else if (a[1] > atol)
      f.vi[2] = -1;
  }
  else
    return 0; // nan snuck through

  const bool bRepaired = (nullptr != dV) ? f.Repair(vertex_count, dV) : f.Repair(vertex_count, fV);
  return bRepaired ? 2 : 0;
}